

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

unsigned_fast_type math::wide_integer::detail::msb_helper<unsigned_short>(uint16_t *u)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *u;
  uVar2 = uVar1 >> 8;
  if (0xff >= uVar1) {
    uVar2 = uVar1;
  }
  uVar4 = (ulong)(0xff < uVar1) * 8;
  uVar1 = uVar2 >> 4;
  uVar3 = uVar4 + 4;
  if ((uVar2 & 0xf0) == 0) {
    uVar1 = uVar2;
    uVar3 = uVar4;
  }
  uVar2 = uVar1 >> 2;
  uVar4 = uVar3 + 2;
  if ((uVar1 & 0xc) == 0) {
    uVar2 = uVar1;
    uVar4 = uVar3;
  }
  return uVar2 >> 1 & 1 | uVar4;
}

Assistant:

constexpr auto msb_helper<std::uint16_t>(const std::uint16_t& u) -> unsigned_fast_type
  {
    auto r = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto x = static_cast<std::uint_fast16_t>(u);

    // Use O(log2[N]) binary-halving in an unrolled loop to find the msb.
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0xFF00)) != UINT16_C(0)) { x = static_cast<std::uint_fast16_t>(x >> static_cast<unsigned>(UINT8_C(8))); r = static_cast<unsigned_fast_type>(r | UINT32_C(8)); }
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0x00F0)) != UINT16_C(0)) { x = static_cast<std::uint_fast16_t>(x >> static_cast<unsigned>(UINT8_C(4))); r = static_cast<unsigned_fast_type>(r | UINT32_C(4)); }
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0x000C)) != UINT16_C(0)) { x = static_cast<std::uint_fast16_t>(x >> static_cast<unsigned>(UINT8_C(2))); r = static_cast<unsigned_fast_type>(r | UINT32_C(2)); }
    if(static_cast<std::uint_fast16_t>(static_cast<std::uint_fast32_t>(x) & UINT32_C(0x0002)) != UINT16_C(0)) {                                                                              r = static_cast<unsigned_fast_type>(r | UINT32_C(1)); }

    return r;
  }